

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O2

SQInteger __thiscall SQFuncState::PushTarget(SQFuncState *this,SQInteger n)

{
  SQInteger local_18;
  
  local_18 = n;
  if (n == -1) {
    local_18 = AllocStackPos(this);
  }
  sqvector<long_long>::push_back(&this->_targetstack,&local_18);
  return local_18;
}

Assistant:

SQInteger SQFuncState::PushTarget(SQInteger n)
{
    if(n!=-1){
        _targetstack.push_back(n);
        return n;
    }
    n=AllocStackPos();
    _targetstack.push_back(n);
    return n;
}